

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Algorithms.cpp
# Opt level: O2

bool __thiscall Algorithms::isPrime_MillerRabin(Algorithms *this,BigInteger *n,int k)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  BigInteger x;
  BigInteger a;
  BigInteger m;
  BigInteger local_b0;
  BigInteger local_90;
  BigInteger local_70;
  BigInteger local_50;
  
  BigIntegerLibrary::BigInteger::operator%(&m,n,2);
  BigIntegerLibrary::BigInteger::BigInteger(&a,0);
  bVar1 = BigIntegerLibrary::BigInteger::operator==(&m,&a);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&a);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&m);
  if (bVar1) {
    bVar1 = false;
  }
  else {
    BigIntegerLibrary::BigInteger::operator-(&m,n,1);
    iVar3 = -1;
    while( true ) {
      BigIntegerLibrary::BigInteger::operator%(&a,&m,2);
      BigIntegerLibrary::BigInteger::BigInteger(&x,0);
      bVar1 = BigIntegerLibrary::BigInteger::operator==(&a,&x);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)&x);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)&a);
      if (!bVar1) break;
      iVar3 = iVar3 + 1;
      BigIntegerLibrary::BigInteger::operator/=(&m,2);
    }
    iVar5 = 0;
    iVar2 = 0;
    if (0 < k) {
      iVar2 = k;
    }
    if (iVar3 < 1) {
      iVar3 = iVar5;
    }
    for (; iVar5 != iVar2; iVar5 = iVar5 + 1) {
      BigIntegerLibrary::BigInteger::BigInteger(&local_70,2);
      BigIntegerLibrary::BigInteger::operator-(&local_50,n,2);
      random((Algorithms *)&a);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)&local_50);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)&local_70);
      BigIntegerLibrary::powm(&x,&a,&m,n);
      BigIntegerLibrary::BigInteger::BigInteger(&local_90,1);
      bVar1 = BigIntegerLibrary::BigInteger::operator==(&x,&local_90);
      if (bVar1) {
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  ((_Vector_base<int,_std::allocator<int>_> *)&local_90);
      }
      else {
        BigIntegerLibrary::BigInteger::operator-(&local_b0,n,1);
        bVar1 = BigIntegerLibrary::BigInteger::operator==(&x,&local_b0);
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  ((_Vector_base<int,_std::allocator<int>_> *)&local_b0);
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  ((_Vector_base<int,_std::allocator<int>_> *)&local_90);
        iVar4 = iVar3 + 1;
        while (bVar1 == false) {
          iVar4 = iVar4 + -1;
          if (iVar4 == 0) {
LAB_00106b98:
            std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                      ((_Vector_base<int,_std::allocator<int>_> *)&x);
            std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                      ((_Vector_base<int,_std::allocator<int>_> *)&a);
            goto LAB_00106bac;
          }
          BigIntegerLibrary::BigInteger::operator*(&local_b0,&x,&x);
          BigIntegerLibrary::BigInteger::operator%(&local_90,&local_b0,n);
          BigIntegerLibrary::BigInteger::operator=(&x,&local_90);
          std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                    ((_Vector_base<int,_std::allocator<int>_> *)&local_90);
          std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                    ((_Vector_base<int,_std::allocator<int>_> *)&local_b0);
          BigIntegerLibrary::BigInteger::BigInteger(&local_90,1);
          bVar1 = BigIntegerLibrary::BigInteger::operator==(&x,&local_90);
          std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                    ((_Vector_base<int,_std::allocator<int>_> *)&local_90);
          if (bVar1) goto LAB_00106b98;
          BigIntegerLibrary::BigInteger::operator-(&local_90,n,1);
          bVar1 = BigIntegerLibrary::BigInteger::operator==(&x,&local_90);
          std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                    ((_Vector_base<int,_std::allocator<int>_> *)&local_90);
        }
      }
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)&x);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)&a);
    }
LAB_00106bac:
    bVar1 = k <= iVar5;
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&m);
  }
  return bVar1;
}

Assistant:

bool Algorithms::isPrime_MillerRabin(const BigInteger &n, int k) {
    if (n % 2 == 0) {
        return false;
    }
    BigInteger m = (n - 1);
    int s = 0;
    while (m % 2 == 0) {
        ++s;
        m /= 2;
    }
    for (int i = 0; i < k; ++i) {
        BigInteger a = random(2, n - 2);
        BigInteger x = powm(a, m, n);
        if (x == 1 || x == n - 1) {
            continue;
        }
        bool flag = false;
        for (int j = 0; j < s - 1; ++j) {
            x = x * x % n;
            if (x == 1) {
                return false;
            }
            if (x == n - 1) {
                flag = true;
                break;
            }
        }
        if (!flag) {
            return false;
        }
    }
    return true;
}